

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O2

DisasJumpType op_vstm(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  TCGv_i64 pTVar1;
  uint uVar2;
  uint uVar3;
  TCGv_i64 arg3;
  DisasJumpType DVar4;
  int iVar5;
  uint8_t reg;
  uint8_t local_50;
  
  tcg_ctx = s->uc->tcg_ctx;
  DVar4 = DISAS_NORETURN;
  uVar2 = get_field1(s,FLD_O_v3,FLD_C_i3);
  uVar3 = get_field1(s,FLD_O_v1,FLD_C_b1);
  iVar5 = (uVar2 & 0xff) - (uVar3 & 0xff);
  if (((uVar2 & 0xff) < (uVar3 & 0xff)) || (0xf < iVar5)) {
    gen_program_exception(s,6);
  }
  else {
    arg3 = tcg_const_i64_s390x(tcg_ctx,(long)(iVar5 * 0x10 + 0x10));
    gen_helper_probe_write_access(tcg_ctx,tcg_ctx->cpu_env,o->addr1,arg3);
    while( true ) {
      reg = (uint8_t)uVar3;
      read_vec_element_i64(tcg_ctx,arg3,reg,'\0',MO_64);
      pTVar1 = o->addr1;
      uVar3 = get_mem_index(s);
      tcg_gen_qemu_st_i64_s390x(tcg_ctx,arg3,pTVar1,(ulong)uVar3,MO_BEQ);
      gen_addi_and_wrap_i64(s,o->addr1,o->addr1,8);
      read_vec_element_i64(tcg_ctx,arg3,reg,'\x01',MO_64);
      pTVar1 = o->addr1;
      uVar3 = get_mem_index(s);
      tcg_gen_qemu_st_i64_s390x(tcg_ctx,arg3,pTVar1,(ulong)uVar3,MO_BEQ);
      local_50 = (uint8_t)uVar2;
      if (local_50 == reg) break;
      gen_addi_and_wrap_i64(s,o->addr1,o->addr1,8);
      uVar3 = (uint)(byte)(reg + 1);
    }
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(arg3 + (long)tcg_ctx));
    DVar4 = DISAS_NEXT;
  }
  return DVar4;
}

Assistant:

static DisasJumpType op_vstm(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t v3 = get_field(s, v3);
    uint8_t v1 = get_field(s, v1);
    TCGv_i64 tmp;

    while (v3 < v1 || (v3 - v1 + 1) > 16) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    /* Probe write access before actually modifying memory */
    tmp = tcg_const_i64(tcg_ctx, (v3 - v1 + 1) * 16);
    gen_helper_probe_write_access(tcg_ctx, tcg_ctx->cpu_env, o->addr1, tmp);

    for (;; v1++) {
        read_vec_element_i64(tcg_ctx, tmp, v1, 0, ES_64);
        tcg_gen_qemu_st_i64(tcg_ctx, tmp, o->addr1, get_mem_index(s), MO_TEQ);
        gen_addi_and_wrap_i64(s, o->addr1, o->addr1, 8);
        read_vec_element_i64(tcg_ctx, tmp, v1, 1, ES_64);
        tcg_gen_qemu_st_i64(tcg_ctx, tmp, o->addr1, get_mem_index(s), MO_TEQ);
        if (v1 == v3) {
            break;
        }
        gen_addi_and_wrap_i64(s, o->addr1, o->addr1, 8);
    }
    tcg_temp_free_i64(tcg_ctx, tmp);
    return DISAS_NEXT;
}